

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::read_piece(torrent *this,piece_index_t piece)

{
  __uniq_ptr_data<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>,_true,_true>
  this_00;
  pointer *pppVar1;
  int *piVar2;
  uint_least32_t *puVar3;
  session_interface *psVar4;
  long lVar5;
  long *plVar6;
  undefined8 uVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint_least32_t uVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  undefined4 extraout_var;
  char *p;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  undefined8 uVar19;
  shared_ptr<libtorrent::aux::torrent> self;
  peer_request r;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [40];
  undefined1 local_90 [56];
  pointer local_58;
  pointer pppStack_50;
  pointer local_48;
  code *pcStack_40;
  _Head_base<0UL,_libtorrent::aux::peer_list_*,_false> local_38;
  _func_int **pp_Var15;
  
  local_b8._24_4_ = 0;
  local_b8[0x1c] = '\0';
  local_b8._32_8_ = &boost::system::detail::cat_holder<void>::system_category_instance;
  local_cc.m_val = piece.m_val;
  if ((((this->super_torrent_hot_members).field_0x4b & 4) != 0) || ((this->field_0x5e0 & 4) != 0)) {
    local_b8._24_4_ = 0x7d;
    cVar8 = '\x01';
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              &boost::system::detail::cat_holder<void>::generic_category_instance;
    goto LAB_0031934c;
  }
  if ((((this->super_torrent_hot_members).m_torrent_file.
        super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files).
      m_piece_length < 1) {
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)libtorrent_category();
    local_b8._24_4_ = 0x6d;
    cVar8 = '\x01';
    if ((*(ulong_long_type *)&p_Var14->_M_use_count == 0x8fafd21e25c5e09b) ||
       (*(ulong_long_type *)&p_Var14->_M_use_count == 0xb2ab117a257edf0d)) goto LAB_0031934c;
    pp_Var15 = p_Var14->_vptr__Sp_counted_base;
    uVar19 = 0x6d;
  }
  else {
    bVar9 = has_piece_passed(this,piece);
    cVar8 = local_b8[0x1c];
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._32_8_;
    if (bVar9) goto LAB_0031934c;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)libtorrent_category();
    local_b8._24_4_ = 0x8d;
    cVar8 = '\x01';
    if ((*(ulong_long_type *)&p_Var14->_M_use_count == 0x8fafd21e25c5e09b) ||
       (*(ulong_long_type *)&p_Var14->_M_use_count == 0xb2ab117a257edf0d)) goto LAB_0031934c;
    pp_Var15 = p_Var14->_vptr__Sp_counted_base;
    uVar19 = 0x8d;
  }
  iVar12 = (*pp_Var15[6])(p_Var14,uVar19);
  cVar8 = (char)iVar12;
LAB_0031934c:
  local_b8._32_8_ = p_Var14;
  local_b8[0x1c] = cVar8;
  if (local_b8[0x1c] == '\x01') {
    iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
               _vptr_session_logger[5])();
    get_handle((torrent *)local_90);
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code&>
              ((alert_manager *)CONCAT44(extraout_var,iVar12),(torrent_handle *)local_90,&local_cc,
               (error_code *)(local_b8 + 0x18));
    if ((tuple<libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
        )local_90._8_8_ != (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar2 = (int *)(local_90._8_8_ + 0xc);
        iVar12 = *piVar2;
        *piVar2 = *piVar2 + -1;
        UNLOCK();
      }
      else {
        iVar12 = *(int *)(local_90._8_8_ + 0xc);
        *(int *)(local_90._8_8_ + 0xc) = iVar12 + -1;
      }
      if (iVar12 == 1) {
        (**(code **)(*(long *)local_90._8_8_ + 0x18))();
      }
    }
  }
  else {
    iVar12 = file_storage::piece_size
                       (&((this->super_torrent_hot_members).m_torrent_file.
                          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->m_files,local_cc.m_val);
    uVar16 = (((this->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_piece_length;
    uVar18 = 0x4000;
    if ((int)uVar16 < 0x4000) {
      uVar18 = uVar16;
    }
    if ((int)uVar16 < 1) {
      uVar18 = 0x4000;
    }
    lVar5 = (long)(int)(iVar12 + uVar18 + -1);
    uVar17 = lVar5 / (long)(int)uVar18;
    iVar11 = (int)uVar17;
    if (iVar11 == 0) {
      local_c8._0_8_ = (_func_int **)0x0;
      local_c8._8_8_ =
           (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            )0x0;
      psVar4 = (this->super_torrent_hot_members).m_ses;
      iVar12 = (*(psVar4->super_session_logger)._vptr_session_logger[5])
                         (psVar4,(ulong)uVar18,lVar5 % (long)(int)uVar18 & 0xffffffff);
      get_handle((torrent *)local_b8);
      local_90._0_8_ = (ulong)(uint)local_90._4_4_ << 0x20;
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::shared_array<char>&,int>
                ((alert_manager *)CONCAT44(extraout_var_02,iVar12),(torrent_handle *)local_b8,
                 &local_cc,(shared_array<char> *)local_c8,(int *)local_90);
      plVar6 = (long *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
      if (plVar6 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar2 = (int *)((long)plVar6 + 0xc);
          iVar12 = *piVar2;
          *piVar2 = *piVar2 + -1;
          UNLOCK();
        }
        else {
          iVar12 = *(int *)((long)plVar6 + 0xc);
          *(int *)((long)plVar6 + 0xc) = iVar12 + -1;
        }
        if (iVar12 == 1) {
          (**(code **)(*plVar6 + 0x18))();
        }
      }
      boost::detail::shared_count::~shared_count((shared_count *)(local_c8 + 8));
    }
    else {
      uVar17 = uVar17 & 0xffffffff;
      local_b8._16_8_ = operator_new(0x38);
      (((peer_connection_hot_members *)(local_b8._16_8_ + 8))->m_have_piece).super_bitfield.m_buf.
      super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
      super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t =
           (tuple<unsigned_int_*,_std::default_delete<unsigned_int[]>_>)0x100000001;
      *(undefined ***)local_b8._16_8_ = &PTR___Sp_counted_ptr_inplace_004f7598;
      this_00.
      super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
      ._M_t.
      super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
      .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl =
           (__uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
            )(local_b8._16_8_ + 0x10);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._16_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8._16_8_ + 0x18))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._16_8_ + 0x20))->
      _vptr__Sp_counted_base = (_func_int **)0x0;
      *(session_settings **)(local_b8._16_8_ + 0x28) = (session_settings *)0x0;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_b8._16_8_ + 0x30))->
      _vptr__Sp_counted_base =
           (_func_int **)&boost::system::detail::cat_holder<void>::system_category_instance;
      p = (char *)operator_new__((long)iVar12,(nothrow_t *)&::std::nothrow);
      boost::shared_array<char>::reset<char>
                ((shared_array<char> *)
                 this_00.
                 super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                 .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl,p);
      if (*(long *)this_00.
                   super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                   .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl == 0) {
        iVar12 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[5])();
        get_handle((torrent *)local_c8);
        local_90._0_5_ = 0x10000000c;
        local_90._8_8_ = &boost::system::detail::cat_holder<void>::generic_category_instance;
        alert_manager::
        emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
                  ((alert_manager *)CONCAT44(extraout_var_03,iVar12),(torrent_handle *)local_c8,
                   &local_cc,(error_code *)local_90);
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_c8._8_8_ !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            puVar3 = (uint_least32_t *)(local_c8._8_8_ + 0xc);
            uVar13 = *puVar3;
            *puVar3 = *puVar3 - 1;
            UNLOCK();
          }
          else {
            uVar13 = *(uint_least32_t *)(local_c8._8_8_ + 0xc);
            *(uint_least32_t *)(local_c8._8_8_ + 0xc) = uVar13 - 1;
          }
          if (uVar13 == 1) {
            (*(code *)(((vector<piece_pos,_piece_index_t> *)local_c8._8_8_)->
                      super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ).
                      super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                      ._M_impl.super__Vector_impl_data._M_start[3])();
          }
        }
      }
      else {
        *(int *)&(((vector<aux::vector<piece_hash_request>,_file_index_t> *)(local_b8._16_8_ + 0x10)
                  )->
                 super_vector<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                 ).
                 super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage = iVar11;
        *(undefined1 *)
         ((long)&(((vector<aux::vector<piece_hash_request>,_file_index_t> *)(local_b8._16_8_ + 0x10)
                  )->
                 super_vector<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                 ).
                 super__Vector_base<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>,_std::allocator<libtorrent::aux::container_wrapper<libtorrent::aux::hash_picker::piece_hash_request,_int,_std::vector<libtorrent::aux::hash_picker::piece_hash_request,_std::allocator<libtorrent::aux::hash_picker::piece_hash_request>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
        iVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                   _vptr_session_logger[0x2e])();
        local_90._0_8_ = CONCAT44(extraout_var_00,iVar10) + 0x438;
        local_90._8_8_ = local_90._8_8_ & 0xffffffffffffff00;
        ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_90);
        local_90[8] = 1;
        iVar10 = *(int *)(CONCAT44(extraout_var_00,iVar10) + 0x23c);
        local_38._M_head_impl =
             (peer_list *)
             this_00.
             super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
             .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>._M_head_impl;
        ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_90);
        local_b8._0_4_ = local_cc.m_val;
        local_b8._4_4_ = 0;
        ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::torrent,void>
                  ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)local_c8,
                   (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
        if (0 < iVar11) {
          local_90._52_4_ = ZEXT14((byte)((iVar10 == 2) << 4));
          do {
            iVar11 = (((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_piece_length;
            local_b8._8_4_ = 0x4000;
            if (iVar11 < 0x4000) {
              local_b8._8_4_ = iVar11;
            }
            if (iVar11 < 1) {
              local_b8._8_4_ = 0x4000;
            }
            if (iVar12 - local_b8._4_4_ <= (int)local_b8._8_4_) {
              local_b8._8_4_ = iVar12 - local_b8._4_4_;
            }
            iVar11 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[4])();
            uVar16 = (this->m_storage).m_idx.m_val;
            local_90._0_8_ = local_c8._0_8_;
            local_90._8_8_ = local_c8._8_8_;
            if ((_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)local_c8._8_8_ !=
                (_Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                pppVar1 = &(((vector<piece_pos,_piece_index_t> *)local_c8._8_8_)->
                           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ).
                           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *(int *)pppVar1 = *(int *)pppVar1 + 1;
                UNLOCK();
              }
              else {
                pppVar1 = &(((vector<piece_pos,_piece_index_t> *)local_c8._8_8_)->
                           super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ).
                           super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *(int *)pppVar1 = *(int *)pppVar1 + 1;
              }
            }
            local_90._24_4_ = local_b8._8_4_;
            local_90._20_4_ = local_b8._4_4_;
            local_90._16_4_ = local_b8._0_4_;
            local_90._32_8_ = local_38._M_head_impl;
            local_90._40_8_ = local_b8._16_8_;
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((peer_connection_hot_members *)(local_b8._16_8_ + 8))->m_have_piece).
                       super_bitfield.m_buf.
                       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t =
                   *(int *)&(((peer_connection_hot_members *)(local_b8._16_8_ + 8))->m_have_piece).
                            super_bitfield.m_buf.
                            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                            _M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                            ._M_t + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((peer_connection_hot_members *)(local_b8._16_8_ + 8))->m_have_piece).
                       super_bitfield.m_buf.
                       super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                       super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                       _M_t =
                   *(int *)&(((peer_connection_hot_members *)(local_b8._16_8_ + 8))->m_have_piece).
                            super_bitfield.m_buf.
                            super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                            _M_t.
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                            ._M_t + 1;
            }
            local_48 = (pointer)0x0;
            pcStack_40 = (code *)0x0;
            local_58 = (pointer)0x0;
            pppStack_50 = (pointer)0x0;
            local_58 = (pointer)operator_new(0x30);
            uVar7 = local_90._40_8_;
            uVar19 = local_90._8_8_;
            *local_58 = (peer_connection *)local_90._0_8_;
            local_58[1] = (peer_connection *)0x0;
            local_90._8_8_ = (piece_picker *)0x0;
            ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
              *)(local_58 + 1))->_M_t =
                 (tuple<libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                  )uVar19;
            local_90._0_8_ = (_func_int **)0x0;
            *(undefined4 *)(local_58 + 3) = local_90._24_4_;
            ((__uniq_ptr_data<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>,_true,_true>
              *)(local_58 + 2))->
            super___uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                 = (__uniq_ptr_impl<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
                    )local_90._16_8_;
            local_58[4] = (peer_connection *)local_90._32_8_;
            local_58[5] = (peer_connection *)0x0;
            local_90._40_8_ = 0;
            local_58[5] = (peer_connection *)uVar7;
            local_90._32_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            pcStack_40 = ::std::
                         _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:779:7)>
                         ::_M_invoke;
            local_48 = (pointer)::std::
                                _Function_handler<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:779:7)>
                                ::_M_manager;
            (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar11) + 0x10))
                      ((long *)CONCAT44(extraout_var_01,iVar11),uVar16,local_b8,&local_58,
                       local_90._52_4_);
            if (local_48 != (pointer)0x0) {
              (*(code *)local_48)(&local_58,&local_58,3);
            }
            iVar11 = (((this->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_piece_length;
            iVar10 = 0x4000;
            if (iVar11 < 0x4000) {
              iVar10 = iVar11;
            }
            if (iVar11 < 1) {
              iVar10 = 0x4000;
            }
            local_b8._4_4_ = local_b8._4_4_ + iVar10;
            uVar16 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar16;
          } while (uVar16 != 0);
        }
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
        if ((__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )local_c8._8_8_ !=
            (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             )0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        }
      }
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._16_8_);
    }
  }
  return;
}

Assistant:

void torrent::read_piece(piece_index_t const piece)
	{
		error_code ec;
		if (m_abort || m_deleted)
		{
			ec.assign(boost::system::errc::operation_canceled, generic_category());
		}
		else if (!valid_metadata())
		{
			ec.assign(errors::no_metadata, libtorrent_category());
		}
		else if (!has_piece_passed(piece))
		{
			ec.assign(errors::invalid_piece_index, libtorrent_category());
		}

		if (ec)
		{
			m_ses.alerts().emplace_alert<read_piece_alert>(get_handle(), piece, ec);
			return;
		}

		const int piece_size = m_torrent_file->piece_size(piece);
		const int blocks_in_piece = (piece_size + block_size() - 1) / block_size();

		TORRENT_ASSERT(blocks_in_piece > 0);
		TORRENT_ASSERT(piece_size > 0);

		if (blocks_in_piece == 0)
		{
			// this shouldn't actually happen
			boost::shared_array<char> buf;
			m_ses.alerts().emplace_alert<read_piece_alert>(
				get_handle(), piece, buf, 0);
			return;
		}

		std::shared_ptr<read_piece_struct> rp = std::make_shared<read_piece_struct>();
		rp->piece_data.reset(new (std::nothrow) char[std::size_t(piece_size)]);
		if (!rp->piece_data)
		{
			m_ses.alerts().emplace_alert<read_piece_alert>(
				get_handle(), piece, error_code(boost::system::errc::not_enough_memory, generic_category()));
			return;
		}
		rp->blocks_left = blocks_in_piece;
		rp->fail = false;

		disk_job_flags_t flags{};
		auto const read_mode = settings().get_int(settings_pack::disk_io_read_mode);
		if (read_mode == settings_pack::disable_os_cache)
			flags |= disk_interface::volatile_read;

		peer_request r;
		r.piece = piece;
		r.start = 0;
		auto self = shared_from_this();
		for (int i = 0; i < blocks_in_piece; ++i, r.start += block_size())
		{
			r.length = std::min(piece_size - r.start, block_size());
			m_ses.disk_thread().async_read(m_storage, r
				, [self, r, rp](disk_buffer_holder block, storage_error const& se) mutable
				{ self->on_disk_read_complete(std::move(block), se, r, rp); }
				, flags);
		}
		m_ses.deferred_submit_jobs();
	}